

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

int Abc_SopGetLitNum(char *pSop)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = 0;
  if (pSop != (char *)0x0) {
    for (; bVar1 = *pSop, bVar1 != 0; pSop = (char *)((byte *)pSop + 1)) {
      iVar2 = (iVar2 - (uint)(bVar1 == 10)) + (uint)((bVar1 & 0xfe) == 0x30);
    }
  }
  return iVar2;
}

Assistant:

int Abc_SopGetLitNum( char * pSop )
{
    char * pCur;
    int nLits = 0;
    if ( pSop == NULL )
        return 0;
    for ( pCur = pSop; *pCur; pCur++ )
    {
        nLits  -= (*pCur == '\n');
        nLits  += (*pCur == '0' || *pCur == '1');
    }
    return nLits;
}